

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

int Sdm_ManCheckDsd6(Sdm_Man_t *p,word t)

{
  int *piVar1;
  uint local_2c;
  int Config;
  int Entry;
  int fCompl;
  word t_local;
  Sdm_Man_t *p_local;
  
  _Entry = t;
  if ((t & 1) != 0) {
    _Entry = t ^ 0xffffffffffffffff;
  }
  t_local = (word)p;
  piVar1 = Hsh_IntManLookup(p->pHash,(uint *)&Entry);
  if (*piVar1 == -1) {
    p_local._4_4_ = 0xffffffff;
  }
  else {
    local_2c = Vec_IntEntry(*(Vec_Int_t **)(t_local + 0x10),*piVar1);
    if ((t & 1) != 0) {
      local_2c = local_2c ^ 0x10000;
    }
    p_local._4_4_ = local_2c;
  }
  return p_local._4_4_;
}

Assistant:

int Sdm_ManCheckDsd6( Sdm_Man_t * p, word t )
{
    int fCompl, Entry, Config;
    if ( (fCompl = (t & 1)) )
        t = ~t;
    Entry = *Hsh_IntManLookup( p->pHash, (unsigned *)&t );
    if ( Entry == -1 )
        return -1;
    Config = Vec_IntEntry( p->vConfgRes, Entry );
    if ( fCompl )
        Config ^= (1 << 16);
    return Config;
}